

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

Lazy<void>
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::alive_detect
          (config *client_config,
          weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
          *watcher)

{
  bool bVar1;
  undefined8 *puVar2;
  LazyPromise<void> *this;
  element_type *peVar3;
  rep rVar4;
  size_t sVar5;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *pEVar6;
  undefined8 *extraout_RAX;
  type_conflict3 *ptVar7;
  type *ptVar8;
  null_logger_t *pnVar9;
  pointer pcVar10;
  type tVar11;
  milliseconds mVar12;
  type_conflict tVar13;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> pVar14;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  io_context_pool *in_stack_fffffffffffffc18;
  memory_order in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  coro_http_client *in_stack_fffffffffffffc40;
  atomic<bool> *in_stack_fffffffffffffc48;
  int local_3b0;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_fffffffffffffc78;
  milliseconds in_stack_fffffffffffffc80;
  int local_340;
  int local_2dc;
  int local_2cc;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *e;
  duration<long,_std::ratio<1L,_1000L>_> *d;
  shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *self;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> *client;
  
  puVar2 = (undefined8 *)operator_new(0x148,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  *puVar2 = alive_detect;
  puVar2[1] = alive_detect;
  e = (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
      (puVar2 + 0x18);
  d = (duration<long,_std::ratio<1L,_1000L>_> *)(puVar2 + 0x19);
  self = (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
         (puVar2 + 0x10);
  client = (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> *
           )(puVar2 + 0x27);
  this = (LazyPromise<void> *)(puVar2 + 2);
  puVar2[0x14] = in_RSI;
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
           (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  async_simple::coro::detail::LazyPromise<void>::LazyPromise
            ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  async_simple::coro::detail::LazyPromise<void>::get_return_object
            ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this);
  bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x145));
  if (!bVar1) {
    *(undefined1 *)((long)puVar2 + 0x144) = 0;
    coro_io::client_pool
              ((void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               (void *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x145));
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::lock
            ((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *
             )CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(puVar2 + 10));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45af80);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      (&(peVar3->pool_config_).host_alive_detect_duration);
    if (rVar4 == 0) goto LAB_0045bbf6;
    std::
    __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x45afaa);
    sVar5 = free_client_count((client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (sVar5 != 0) goto LAB_0045bbf6;
    *(undefined1 *)((long)puVar2 + 0x146) = 1;
    std::
    __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x45afd4);
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_fffffffffffffc48,(bool *)in_stack_fffffffffffffc40,
                       SUB41((uint)in_stack_fffffffffffffc3c >> 0x18,0),in_stack_fffffffffffffc38);
    if (bVar1) {
      std::
      __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x45b02f);
      sVar5 = free_client_count((client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *)
                                CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      if (sVar5 == 0) {
        std::
        __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x45b097);
        pEVar6 = io_context_pool::get_executor(in_stack_fffffffffffffc18);
        puVar2[0x15] = pEVar6;
        std::
        make_unique<cinatra::coro_http_client,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>&>
                  ((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                    *)in_stack_fffffffffffffc18);
        std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
        ::operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                      *)0x45b0d0);
        bVar1 = cinatra::coro_http_client::init_config
                          (in_stack_fffffffffffffc40,
                           (config *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        if (bVar1) {
          do {
            reconnect_impl(client,self);
            async_simple::coro::detail::LazyPromiseBase::
            await_transform<async_simple::coro::Lazy<std::pair<bool,std::chrono::duration<long,std::ratio<1l,1000l>>>>>
                      ((LazyPromiseBase *)
                       CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       (Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
            bVar1 = async_simple::coro::detail::
                    LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                    ::await_ready((LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                                   *)e);
            if (!bVar1) {
              *(undefined1 *)((long)puVar2 + 0x144) = 1;
              coro_io::client_pool
                        ((void *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (void *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              (*(code *)*extraout_RAX)(extraout_RAX);
              return (LazyBase<void,_false>)in_RDI._coro.__handle_;
            }
            puVar2[0x12] = e;
            pVar14 = async_simple::coro::detail::
                     LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ::awaitResume((LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08))
            ;
            *(bool *)(puVar2 + 6) = pVar14.first;
            puVar2[7] = pVar14.second.__r.__r;
            *(undefined1 *)(puVar2 + 0xc) = *(undefined1 *)(puVar2 + 6);
            puVar2[0xd] = puVar2[7];
            async_simple::coro::detail::
            LazyBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>::
            ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x45b3a2);
            async_simple::coro::
            Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::~Lazy
                      ((Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                        *)0x45b3af);
            ptVar7 = std::get<0ul,bool,std::chrono::duration<long,std::ratio<1l,1000l>>>
                               ((pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                                0x45b3e2);
            puVar2[0x1a] = ptVar7;
            ptVar8 = std::get<1ul,bool,std::chrono::duration<long,std::ratio<1l,1000l>>>
                               ((pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                                0x45b3fd);
            puVar2[0x1b] = ptVar8;
            if ((*(byte *)puVar2[0x1a] & 1) == 0) {
              std::
              __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x45b562);
              bVar1 = std::atomic::operator_cast_to_bool
                                ((atomic<bool> *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              if (bVar1) {
                pnVar9 = cinatra::null_logger_t::operator<<
                                   ((null_logger_t *)&cinatra::NULL_LOGGER,
                                    (char (*) [46])"client pool is aliving, stop connect client {");
                pcVar10 = std::
                          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                          ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                                 *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                puVar2[0x1e] = pcVar10;
                pnVar9 = cinatra::null_logger_t::operator<<
                                   (pnVar9,(coro_http_client **)(puVar2 + 0x1e));
                cinatra::null_logger_t::operator<<(pnVar9,(char (*) [19])"} for alive detect");
                async_simple::coro::detail::LazyPromise<void>::return_void(this);
                local_340 = 3;
              }
              else {
                pnVar9 = cinatra::null_logger_t::operator<<
                                   ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
                pcVar10 = std::
                          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                          ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                                 *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                puVar2[0x1f] = pcVar10;
                pnVar9 = cinatra::null_logger_t::operator<<
                                   (pnVar9,(coro_http_client **)(puVar2 + 0x1f));
                cinatra::null_logger_t::operator<<
                          (pnVar9,(char (*) [33])"} failed. continue alive detect.");
                std::
                __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x45b66b);
                tVar11 = std::chrono::operator-
                                   ((duration<long,_std::ratio<1L,_1000L>_> *)
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                                    (duration<long,_std::ratio<1L,_1000L>_> *)
                                    CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
                puVar2[0x22] = tVar11.__r;
                mVar12 = ms<(char)49>();
                puVar2[0x23] = mVar12.__r;
                tVar13 = std::chrono::operator/
                                   ((duration<long,_std::ratio<1L,_1000L>_> *)
                                    CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                    (duration<long,_std::ratio<1L,_1000L>_> *)
                                    CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
                puVar2[0x21] = tVar13;
                in_stack_fffffffffffffc80 = ms<(char)49>();
                puVar2[0x24] = in_stack_fffffffffffffc80.__r;
                in_stack_fffffffffffffc78 =
                     std::chrono::operator*
                               ((long *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                ),(duration<long,_std::ratio<1L,_1000L>_> *)0x45b70e
                               );
                mVar12.__r._4_4_ = in_stack_fffffffffffffbfc;
                mVar12.__r._0_4_ = in_stack_fffffffffffffbf8;
                mVar12 = rand_time(mVar12);
                ((duration<long,_std::ratio<1L,_1000L>_> *)(puVar2 + 0x20))->__r = mVar12.__r;
                std::
                shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                              *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                             (nullptr_t)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                std::
                shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                            (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                             *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                std::
                shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                               *)0x45b785);
                rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                                  ((duration<long,_std::ratio<1L,_1000L>_> *)(puVar2 + 0x20));
                if (0 < rVar4) {
                  pcVar10 = std::
                            unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                            ::operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                                          *)0x45b7a9);
                  cinatra::coro_http_client::get_executor(pcVar10);
                  sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
                            (d,e);
                  async_simple::coro::detail::LazyPromiseBase::
                  await_transform<async_simple::coro::Lazy<void>>
                            ((LazyPromiseBase *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                             (Lazy<void> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  bVar1 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                                    ((LazyAwaiterBase<void> *)(puVar2 + 0x25));
                  if (!bVar1) {
                    *(undefined1 *)((long)puVar2 + 0x144) = 2;
                    coro_io::client_pool
                              ((void *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                               ,(void *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08
                                                ));
                    (*(code *)*extraout_RAX_00)(extraout_RAX_00);
                    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
                  }
                  puVar2[0x13] = (LazyAwaiterBase<void> *)(puVar2 + 0x25);
                  async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                            ((LazyAwaiterBase<void> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                            ((ValueAwaiter *)0x45b978);
                  async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x45b985);
                }
                std::
                weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::lock((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                        *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
                std::
                shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                            (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                             *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                std::
                shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                ::~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                               *)0x45b9ea);
                std::
                __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x45b9f7);
                bVar1 = std::atomic::operator_cast_to_bool
                                  ((atomic<bool> *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
                if (bVar1) {
                  pnVar9 = cinatra::null_logger_t::operator<<
                                     ((null_logger_t *)&cinatra::NULL_LOGGER,
                                      (char (*) [46])"client pool is aliving, stop connect client {"
                                     );
                  pcVar10 = std::
                            unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                            ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                                   *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  (client->_M_t).
                  super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
                  .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl = pcVar10;
                  pnVar9 = cinatra::null_logger_t::operator<<(pnVar9,(coro_http_client **)client);
                  cinatra::null_logger_t::operator<<(pnVar9,(char (*) [19])"} for alive detect");
                  async_simple::coro::detail::LazyPromise<void>::return_void(this);
                  local_3b0 = 3;
                }
                else {
                  local_3b0 = 0;
                }
                local_340 = local_3b0;
              }
            }
            else {
              pnVar9 = cinatra::null_logger_t::operator<<
                                 ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
              pcVar10 = std::
                        unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                        ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                               *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
              puVar2[0x1c] = pcVar10;
              pnVar9 = cinatra::null_logger_t::operator<<
                                 (pnVar9,(coro_http_client **)(puVar2 + 0x1c));
              cinatra::null_logger_t::operator<<
                        (pnVar9,(char (*) [30])"} success. stop alive detect.");
              std::
              __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x45b488);
              std::
              unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              ::unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                            *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                            *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              collect_free_client((client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>
                                   *)in_stack_fffffffffffffc80.__r,
                                  (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                                   *)in_stack_fffffffffffffc78.__r);
              std::
              unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              ::~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
              std::
              __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x45b4d6);
              std::atomic<bool>::operator=
                        ((atomic<bool> *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         SUB41((uint)in_stack_fffffffffffffbec >> 0x18,0));
              async_simple::coro::detail::LazyPromise<void>::return_void(this);
              local_340 = 3;
            }
          } while (local_340 == 0);
          local_2dc = local_340;
        }
        else {
          cinatra::cerr_logger_t::operator<<
                    ((cerr_logger_t *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char (*) [70])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          cinatra::cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x45b120);
          async_simple::coro::detail::LazyPromise<void>::return_void(this);
          local_2dc = 3;
        }
        std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
        ::~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                       *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        local_2cc = local_2dc;
      }
      else {
        std::
        __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x45b04a);
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   SUB41((uint)in_stack_fffffffffffffbec >> 0x18,0));
        async_simple::coro::detail::LazyPromise<void>::return_void(this);
        local_2cc = 3;
      }
    }
    else {
      async_simple::coro::detail::LazyPromise<void>::return_void(this);
      local_2cc = 3;
    }
  }
  else {
LAB_0045bbf6:
    in_stack_fffffffffffffc04 = 0;
    local_2cc = 0;
  }
  std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               *)0x45bc1b);
  if (local_2cc == 0) {
    async_simple::coro::detail::LazyPromise<void>::return_void(this);
  }
  else {
    in_stack_fffffffffffffbfc = local_2cc;
    if (local_2cc != 3) goto LAB_0045bce4;
  }
  async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this);
  bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                    ((FinalAwaiter *)((long)puVar2 + 0x147));
  if (!bVar1) {
    *puVar2 = 0;
    *(undefined1 *)((long)puVar2 + 0x144) = 3;
    coro_io::client_pool
              ((void *)CONCAT44(in_stack_fffffffffffffc04,local_2cc),
               (void *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    (*(code *)*extraout_RAX_01)(extraout_RAX_01);
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
            ((FinalAwaiter *)((long)puVar2 + 0x147));
LAB_0045bce4:
  async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x45bcfc);
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  ~weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
            0x45bd09);
  if (puVar2 != (undefined8 *)0x0) {
    operator_delete(puVar2,0x148);
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

static async_simple::coro::Lazy<void> alive_detect(
      const typename client_t::config& client_config,
      std::weak_ptr<client_pool> watcher) {
    std::shared_ptr<client_pool> self = watcher.lock();
    using namespace std::chrono_literals;
    if (self && self->pool_config_.host_alive_detect_duration.count() != 0 &&
        self->free_client_count() == 0) {
      bool expected = true;
      if (!self->is_alive_.compare_exchange_strong(
              expected, false)) {  // other alive detect coroutine is running.
        co_return;
      }
      if (self->free_client_count() > 0) {  // recheck for multi-thread
        self->is_alive_ = true;
        co_return;
      }
      auto executor = self->io_context_pool_.get_executor();
      auto client = std::make_unique<client_t>(*executor);
      if (!client->init_config(client_config))
        AS_UNLIKELY {
          CINATRA_LOG_ERROR
              << "Init client config failed in host alive detect. That "
                 "is not expected.";
          co_return;
        }
      while (true) {
        auto [ok, cost_time] = co_await reconnect_impl(client, self);
        if (ok) {
          CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                            << "} success. stop alive detect.";
          self->collect_free_client(std::move(client));
          self->is_alive_ =
              true; /*if client close(), we still mark it as alive*/
          co_return;
        }
        if (self->is_alive_) {
          CINATRA_LOG_TRACE << "client pool is aliving, stop connect client {"
                            << client.get() << "} for alive detect";
          co_return;
        }
        CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                          << "} failed. continue alive detect.";
        auto wait_time = rand_time(
            (self->pool_config_.host_alive_detect_duration - cost_time) / 1ms *
            1ms);
        self = nullptr;
        if (wait_time.count() > 0) {
          co_await coro_io::sleep_for(wait_time, &client->get_executor());
        }
        self = watcher.lock();
        if (self->is_alive_) {
          CINATRA_LOG_TRACE << "client pool is aliving, stop connect client {"
                            << client.get() << "} for alive detect";
          co_return;
        }
      }
    }